

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_helpers.h
# Opt level: O2

void test_helper_psa_done(int line,char *file)

{
  test_helper_is_psa_pristine(line,file);
  mbedtls_psa_crypto_free();
  return;
}

Assistant:

static void test_helper_psa_done( int line, const char *file )
{
    (void) test_helper_is_psa_pristine( line, file );
    mbedtls_psa_crypto_free( );
}